

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool openjtalk_speakToFile(OpenJTalk *oj,char *text,char *file_utf8)

{
  SpeakData *pSVar1;
  _Bool _Var2;
  FILE *__stream;
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    if (((text == (char *)0x0 || file_utf8 == (char *)0x0) || (*file_utf8 == '\0')) ||
       (*text == '\0')) {
      oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
    }
    else {
      __stream = fopen(file_utf8,"wb");
      pSVar1 = g_psd;
      if (__stream != (FILE *)0x0) {
        g_psd->sampling_frequency = 0;
        pSVar1->data = (short *)0x0;
        pSVar1->length = 0;
        _Var2 = Open_JTalk_synthesis(oj->open_jtalk,text,(FILE *)__stream,(FILE *)0x0);
        fclose(__stream);
        return _Var2;
      }
      oj->errorCode = OPENJTALKERROR_FILE_OPEN_ERROR;
    }
  }
  return false;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_speakToFile(OpenJTalk *oj, const char *text, const char *file_utf8)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return false;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (file_utf8 == NULL || text == NULL)
	{
		oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
		return false;
	}
	if (strlen(file_utf8) == 0 || strlen(text) == 0)
	{
		oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
		return false;
	}
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MINGW32__)
	wchar_t file_utf16[MAX_PATH];
	if (!u8tou16_path(file_utf8, file_utf16))
	{
		return false;
	}
	FILE *wavfp = _wfopen((wchar_t *)file_utf16, u"wb");
#else
	FILE *wavfp = fopen(file_utf8, "wb");
#endif
	if (!wavfp)
	{
		oj->errorCode = OPENJTALKERROR_FILE_OPEN_ERROR;
		return false;
	}
	bool result = generate_wavFile(oj, text, wavfp);
	fclose(wavfp);
	return result;
}